

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O3

bool __thiscall CppJieba::Trie::loadDict(Trie *this,char *filePath)

{
  uint uVar1;
  bool bVar2;
  allocator local_249;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  string local_228;
  uint auStack_208 [124];
  
  if (this->_initFlag == false) {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"not initted.","");
    Limonp::Logger::LoggingF(3,"Trie.hpp",0x82,&local_228);
  }
  else {
    std::__cxx11::string::string((string *)local_248,filePath,&local_249);
    std::fstream::fstream(&local_228);
    std::fstream::open((char *)&local_228,(_Ios_Openmode)local_248[0]);
    uVar1 = *(uint *)((long)auStack_208 + *(long *)(local_228._M_dataplus._M_p + -0x18));
    std::fstream::~fstream(&local_228);
    if (local_248[0] != local_238) {
      operator_delete(local_248[0]);
    }
    if ((uVar1 & 5) == 0) {
      bVar2 = _trieInsert(this,filePath);
      if (bVar2) {
        bVar2 = _countWeight(this);
        if (bVar2) {
          return true;
        }
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"_countWeight failed.","");
        Limonp::Logger::LoggingF(3,"Trie.hpp",0x95,&local_228);
      }
      else {
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"_trieInsert failed.","");
        Limonp::Logger::LoggingF(3,"Trie.hpp",0x8f,&local_228);
      }
    }
    else {
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"cann\'t find fiel[%s].","");
      Limonp::Logger::LoggingF(3,"Trie.hpp",0x88,&local_228,filePath);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool loadDict(const char * const filePath)
            {
                if(!_getInitFlag())
                {
                    LogError("not initted.");
                    return false;
                }

                if(!checkFileExist(filePath))
                {
                    LogError("cann't find fiel[%s].",filePath);
                    return false;
                }
                bool res = false;
                res = _trieInsert(filePath);
                if(!res)
                {
                    LogError("_trieInsert failed.");
                    return false;
                }
                res = _countWeight();
                if(!res)
                {
                    LogError("_countWeight failed.");
                    return false;
                }
                return true;
            }